

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O3

void sys_init_fdpoll(void)

{
  _instanceinter *p_Var1;
  t_fdpoll *ptVar2;
  _binbuf *p_Var3;
  
  if ((pd_maininstance.pd_inter)->i_fdpoll == (t_fdpoll *)0x0) {
    ptVar2 = (t_fdpoll *)getbytes(0);
    p_Var1 = pd_maininstance.pd_inter;
    (pd_maininstance.pd_inter)->i_fdpoll = ptVar2;
    p_Var1->i_nfdpoll = 0;
    p_Var3 = binbuf_new();
    (pd_maininstance.pd_inter)->i_inbinbuf = p_Var3;
  }
  return;
}

Assistant:

void sys_init_fdpoll(void)
{
    if (INTER->i_fdpoll)
        return;
    /* create an empty FD poll list */
    INTER->i_fdpoll = (t_fdpoll *)t_getbytes(0);
    INTER->i_nfdpoll = 0;
    INTER->i_inbinbuf = binbuf_new();
}